

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void anon_unknown.dwarf_1357f::string_arg(string *option,int i,int argc,char **argv,char *arg)

{
  char *__s;
  char *pcVar1;
  
  if (i != argc) {
    __s = argv[i];
    pcVar1 = (char *)option->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)option,0,pcVar1,(ulong)__s);
    return;
  }
  insufficient_args(arg);
  return;
}

Assistant:

void string_arg(std::string &option, int i,
    int argc, char *argv[], const char *arg)
{
    if (i == argc)
    {
        insufficient_args(arg);
    }
    option = argv[i];
}